

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction_job.h
# Opt level: O2

void __thiscall
r_exec::BatchReductionJob<r_exec::SecondaryMDLController,_r_exec::Fact,_r_exec::MDLController>::
BatchReductionJob(BatchReductionJob<r_exec::SecondaryMDLController,_r_exec::Fact,_r_exec::MDLController>
                  *this,SecondaryMDLController *processor,Fact *trigger,MDLController *controller)

{
  atomic_int_fast64_t *paVar1;
  
  _ReductionJob::_ReductionJob(&this->super__ReductionJob);
  (this->super__ReductionJob).super__Object._vptr__Object =
       (_func_int **)&PTR__BatchReductionJob_001d2710;
  (this->processor).object = (_Object *)processor;
  if (processor != (SecondaryMDLController *)0x0) {
    LOCK();
    paVar1 = &(processor->super_MDLController).super_HLPController.super_OController.
              super_Controller.super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  (this->trigger).object = (_Object *)trigger;
  if (trigger != (Fact *)0x0) {
    LOCK();
    paVar1 = &(trigger->super__Fact).super_LObject.super_Object<r_code::LObject,_r_exec::LObject>.
              super_LObject.super_Code.super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  (this->controller).object = (_Object *)controller;
  if (controller != (MDLController *)0x0) {
    LOCK();
    paVar1 = &(controller->super_HLPController).super_OController.super_Controller.super__Object.
              refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

BatchReductionJob(_P *processor, T *trigger, C *controller): _ReductionJob(), processor(processor), trigger(trigger), controller(controller) {}